

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alListeneri(ALenum param,ALint value)

{
  anon_union_4_2_32316eff cvt;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alListeneri);
  writele32(param);
  writele32(value);
  (*REAL_alListeneri)(param,value);
  check_listener_state();
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alListeneri(ALenum param, ALint value)
{
    IO_START(alListeneri);
    IO_ENUM(param);
    IO_INT32(value);
    REAL_alListeneri(param, value);
    check_listener_state();
    IO_END();
}